

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

void __thiscall
Memory::HeapBlockMap64::VerifyMarkCountForPages<256u>
          (HeapBlockMap64 *this,void *address,uint pageCount)

{
  code *pcVar1;
  bool bVar2;
  Node *pNVar3;
  undefined4 *puVar4;
  Node *node;
  uint pageCount_local;
  void *address_local;
  HeapBlockMap64 *this_local;
  
  pNVar3 = FindNode(this,address);
  if (pNVar3 == (Node *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x610,"(node != nullptr)","node != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  HeapBlockMap32::VerifyMarkCountForPages<256u>(&pNVar3->map,address,pageCount);
  return;
}

Assistant:

void
HeapBlockMap64::VerifyMarkCountForPages(void * address, uint pageCount)
{
    Node * node = FindNode(address);
    Assert(node != nullptr);

    node->map.VerifyMarkCountForPages<BitVectorCount>(address, pageCount);
}